

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printDstIdx(MCInst *MI,uint Op,SStream *O)

{
  uint8_t *puVar1;
  SStream *O_local;
  uint Op_local;
  MCInst *MI_local;
  
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x3e;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    MI->flat_insn->detail->groups
    [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] = MI->x86opsize;
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x4a;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x4e;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x52;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x56;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
  }
  if (MI->csh->mode == CS_MODE_64) {
    SStream_concat(O,"[");
  }
  else {
    SStream_concat(O,"es:[");
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46;
      puVar1[0] = '\x1c';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
  }
  set_mem_access(MI,true);
  printOperand(MI,Op,O);
  SStream_concat0(O,"]");
  set_mem_access(MI,false);
  return;
}

Assistant:

static void printDstIdx(MCInst *MI, unsigned Op, SStream *O)
{
	if (MI->csh->detail) {
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->x86opsize;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.index = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = 1;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = 0;
	}

	// DI accesses are always ES-based on non-64bit mode
	if (MI->csh->mode != CS_MODE_64) {
		SStream_concat0(O, "%es:(");
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_ES;
		}
	} else
		SStream_concat0(O, "(");

	set_mem_access(MI, true);

	printOperand(MI, Op, O);

	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}